

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_interface.h
# Opt level: O0

void __thiscall cppnet::Socket::~Socket(Socket *this)

{
  Socket *this_local;
  
  this->_vptr_Socket = (_func_int **)&PTR__Socket_0016b040;
  std::weak_ptr<cppnet::Dispatcher>::~weak_ptr(&this->_dispatcher);
  std::weak_ptr<cppnet::EventActions>::~weak_ptr(&this->_event_actions);
  std::weak_ptr<cppnet::CppNetBase>::~weak_ptr(&this->_cppnet_base);
  Address::~Address(&this->_addr);
  return;
}

Assistant:

virtual ~Socket() {}